

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  string *psVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  int iVar3;
  EnumDescriptor *pEVar4;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *arg;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  FieldDescriptor *local_60;
  key_arg<std::basic_string_view<char>_> local_58;
  VoidPtr local_48;
  code *pcStack_40;
  iterator local_38;
  iterator local_28;
  
  local_60 = field;
  if ((field->field_0x1 & 8) != 0) {
    psVar1 = field->containing_type_->all_names_;
    local_58._M_str = psVar1[1]._M_dataplus._M_p;
    local_58._M_len = psVar1[1]._M_string_length;
    if ((anonymous_namespace)::
        AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)::
        allowed_proto3_extendees_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)
                                   ::allowed_proto3_extendees_abi_cxx11_);
      if (iVar3 != 0) {
        arg = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)(anonymous_namespace)::NewAllowedProto3Extendee_abi_cxx11_();
        internal::OnShutdownRun
                  (internal::
                   OnShutdownDelete<absl::lts_20240722::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::anon_class_1_0_00000001::__invoke,arg);
        (anonymous_namespace)::
        AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)::
        allowed_proto3_extendees_abi_cxx11_ = arg;
        __cxa_guard_release(&(anonymous_namespace)::
                             AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)
                             ::allowed_proto3_extendees_abi_cxx11_);
      }
    }
    local_28 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((anonymous_namespace)::
                          AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)
                          ::allowed_proto3_extendees_abi_cxx11_,&local_58);
    local_38.ctrl_ = (ctrl_t *)0x0;
    bVar2 = absl::lts_20240722::container_internal::operator==(&local_28,&local_38);
    if (bVar2) {
      element_name._M_str = local_60->all_names_[1]._M_dataplus._M_p;
      element_name._M_len = local_60->all_names_[1]._M_string_length;
      AddError(this,element_name,&proto->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  if ((local_60->merged_features_->field_0)._impl_.field_presence_ == 3) {
    element_name_00._M_str = local_60->all_names_[1]._M_dataplus._M_p;
    element_name_00._M_len = local_60->all_names_[1]._M_string_length;
    AddError(this,element_name_00,&proto->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
  }
  if ((local_60->field_0x1 & 1) != 0) {
    element_name_01._M_str = local_60->all_names_[1]._M_dataplus._M_p;
    element_name_01._M_len = local_60->all_names_[1]._M_string_length;
    AddError(this,element_name_01,&proto->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (local_60->type_ == '\x0e') {
    pEVar4 = FieldDescriptor::enum_type(local_60);
    if (pEVar4 != (EnumDescriptor *)0x0) {
      pEVar4 = FieldDescriptor::enum_type(local_60);
      if ((pEVar4->merged_features_->field_0)._impl_.enum_type_ == 2) {
        local_58._M_len = (size_t)&local_60;
        local_48.obj = &local_58;
        pcStack_40 = absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = local_48.obj;
        element_name_02._M_str = local_60->all_names_[1]._M_dataplus._M_p;
        element_name_02._M_len = local_60->all_names_[1]._M_string_length;
        AddError(this,element_name_02,&proto->super_Message,TYPE,make_error);
      }
    }
  }
  if (local_60->type_ == '\n') {
    element_name_03._M_str = local_60->all_names_[1]._M_dataplus._M_p;
    element_name_03._M_len = local_60->all_names_[1]._M_string_length;
    AddError(this,element_name_03,&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(const FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() && field->enum_type()->is_closed()) {
    // Proto3 messages can only use open enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE, [&] {
          return absl::StrCat("Enum type \"", field->enum_type()->full_name(),
                              "\" is not an open enum, but is used in \"",
                              field->containing_type()->full_name(),
                              "\" which is a proto3 message type.");
        });
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}